

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O0

int FindUnixPipes(void)

{
  char *pcVar1;
  int *piVar2;
  long lVar3;
  unixjob *puVar4;
  bool local_35;
  int local_34;
  int i;
  unixjob cleareduj;
  int inttmp;
  char *envtmp;
  
  UnixPID = -1;
  StartTime = -1;
  UnixPipeOut = -1;
  UnixPipeIn = -1;
  pcVar1 = getenv("LDEPIPEIN");
  if (pcVar1 != (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(pcVar1,(char **)0x0,10);
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      UnixPipeIn = (int)lVar3;
    }
  }
  pcVar1 = getenv("LDEPIPEOUT");
  if (pcVar1 != (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(pcVar1,(char **)0x0,10);
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      UnixPipeOut = (int)lVar3;
    }
  }
  pcVar1 = getenv("LDESTARTTIME");
  if (pcVar1 != (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(pcVar1,(char **)0x0,10);
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      StartTime = (long)(int)lVar3;
    }
  }
  pcVar1 = getenv("LDEUNIXPID");
  if (pcVar1 != (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(pcVar1,(char **)0x0,10);
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      UnixPID = (int)lVar3;
    }
  }
  lVar3 = sysconf(4);
  NPROCS = (int)lVar3;
  UJ = (unixjob *)malloc((long)NPROCS * 0x18);
  for (local_34 = 0; local_34 < NPROCS; local_34 = local_34 + 1) {
    puVar4 = UJ + local_34;
    puVar4->pathname = (char *)0x0;
    puVar4->PID = 0;
    puVar4->status = -1;
    *(ulong *)&puVar4->type = (ulong)(uint)cleareduj.status << 0x20;
  }
  local_35 = true;
  if (((UnixPipeIn != -1) && (local_35 = true, UnixPipeOut != -1)) &&
     (local_35 = true, StartTime != -1)) {
    local_35 = UnixPID == -1;
  }
  return (int)local_35;
}

Assistant:

int FindUnixPipes(void) {
  char *envtmp;
  int inttmp;
  struct unixjob cleareduj;

  DBPRINT(("Entering FindUnixPipes\n"));
  UnixPipeIn = UnixPipeOut = StartTime = UnixPID = -1;
  if ((envtmp = getenv("LDEPIPEIN"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      UnixPipeIn = inttmp;
  }
  if ((envtmp = getenv("LDEPIPEOUT"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      UnixPipeOut = inttmp;
  }
  if ((envtmp = getenv("LDESTARTTIME"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      StartTime = inttmp;
  }
  if ((envtmp = getenv("LDEUNIXPID"))) {
    errno = 0;
    inttmp = (int)strtol(envtmp, (char **)NULL, 10);
    if (errno == 0)
      UnixPID = inttmp;
  }

/* This is a good place to initialize stuff like the UJ table */
  NPROCS = sysconf(_SC_OPEN_MAX);

  UJ = (struct unixjob *)malloc(NPROCS * sizeof(struct unixjob));
  cleareduj.status = -1;
  cleareduj.pathname = NULL;
  cleareduj.PID = 0;
  cleareduj.type = UJUNUSED;
  for (int i = 0; i < NPROCS; i++) UJ[i] = cleareduj;

  DBPRINT(("NPROCS is %d; leaving FindUnixPipes\n", NPROCS));
  return (UnixPipeIn == -1 || UnixPipeOut == -1 || StartTime == -1 || UnixPID == -1);
}